

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validationinterface.cpp
# Opt level: O2

void __thiscall
ValidationSignals::TransactionRemovedFromMempool
          (ValidationSignals *this,CTransactionRef *tx,MemPoolRemovalReason reason,
          uint64_t mempool_sequence)

{
  unique_ptr<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_> uVar1;
  bool bVar2;
  _func_void *p_Var3;
  CTransactionRef *pCVar4;
  anon_class_40_4_21c3dbda_for_event *this_00;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  _Any_data local_118;
  code *local_108;
  code *pcStack_100;
  char *local_name;
  anon_class_40_4_21c3dbda_for_event event;
  MemPoolRemovalReason reason_local;
  undefined1 local_c0 [32];
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> local_a0;
  undefined4 local_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined8 local_80;
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &event;
  pCVar4 = tx;
  reason_local = reason;
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)this_00,
             &tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  local_name = "TransactionRemovedFromMempool";
  event.reason = reason;
  event.mempool_sequence = mempool_sequence;
  event.this = this;
  bVar2 = ::LogAcceptCategory((LogFlags)this_00,(Level)pCVar4);
  local_c0._0_8_ = "TransactionRemovedFromMempool";
  if (bVar2) {
    base_blob<256u>::ToString_abi_cxx11_
              ((string *)local_c0,
               (base_blob<256u> *)
               &((tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                hash);
    base_blob<256u>::ToString_abi_cxx11_
              (&local_58,
               (base_blob<256u> *)
               &((tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                m_witness_hash);
    RemovalReasonToString_abi_cxx11_(&local_78,&reason_local);
    logging_function._M_str = "TransactionRemovedFromMempool";
    logging_function._M_len = 0x1d;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validationinterface.cpp"
    ;
    source_file._M_len = 0x67;
    LogPrintFormatInternal<char_const*,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
              (logging_function,source_file,0xd1,VALIDATION,Debug,
               (ConstevalFormatString<4U>)0x6c8f35,&local_name,(string *)local_c0,&local_58,
               &local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)local_c0);
    local_c0._0_8_ = local_name;
  }
  uVar1._M_t.
  super___uniq_ptr_impl<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>.
  _M_t.
  super__Tuple_impl<0UL,_util::TaskRunnerInterface_*,_std::default_delete<util::TaskRunnerInterface>_>
  .super__Head_base<0UL,_util::TaskRunnerInterface_*,_false>._M_head_impl =
       (((this->m_internals)._M_t.
         super___uniq_ptr_impl<ValidationSignalsImpl,_std::default_delete<ValidationSignalsImpl>_>.
         _M_t.
         super__Tuple_impl<0UL,_ValidationSignalsImpl_*,_std::default_delete<ValidationSignalsImpl>_>
         .super__Head_base<0UL,_ValidationSignalsImpl_*,_false>._M_head_impl)->m_task_runner)._M_t;
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)(local_c0 + 8),
             &tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  local_c0._24_4_ = reason_local;
  TransactionRemovedFromMempool(std::shared_ptr<CTransaction_const>const&,MemPoolRemovalReason,unsigned_long)
  ::$_1::__1((__1 *)&local_a0,&event);
  local_108 = (code *)0x0;
  pcStack_100 = (code *)0x0;
  local_118._M_unused._M_object = (void *)0x0;
  local_118._8_8_ = 0;
  p_Var3 = (_func_void *)operator_new(0x48);
  *(undefined8 *)p_Var3 = local_c0._0_8_;
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)(p_Var3 + 8),
             (__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)(local_c0 + 8));
  *(undefined4 *)(p_Var3 + 0x18) = local_c0._24_4_;
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)(p_Var3 + 0x20),
             &local_a0);
  *(undefined8 *)(p_Var3 + 0x40) = local_80;
  *(undefined4 *)(p_Var3 + 0x30) = local_90;
  *(undefined4 *)(p_Var3 + 0x34) = uStack_8c;
  *(undefined4 *)(p_Var3 + 0x38) = uStack_88;
  *(undefined4 *)(p_Var3 + 0x3c) = uStack_84;
  pcStack_100 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validationinterface.cpp:206:5)>
                ::_M_invoke;
  local_108 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validationinterface.cpp:206:5)>
              ::_M_manager;
  local_118._M_unused._0_8_ = (undefined8)p_Var3;
  (**(code **)(*(long *)uVar1._M_t.
                        super___uniq_ptr_impl<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_util::TaskRunnerInterface_*,_std::default_delete<util::TaskRunnerInterface>_>
                        .super__Head_base<0UL,_util::TaskRunnerInterface_*,_false>._M_head_impl +
              0x10))(uVar1._M_t.
                     super___uniq_ptr_impl<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_util::TaskRunnerInterface_*,_std::default_delete<util::TaskRunnerInterface>_>
                     .super__Head_base<0UL,_util::TaskRunnerInterface_*,_false>._M_head_impl);
  std::_Function_base::~_Function_base((_Function_base *)&local_118);
  TransactionRemovedFromMempool(std::shared_ptr<CTransaction_const>const&,MemPoolRemovalReason,unsigned_long)
  ::$_0::~__0((__0 *)local_c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&event.tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ValidationSignals::TransactionRemovedFromMempool(const CTransactionRef& tx, MemPoolRemovalReason reason, uint64_t mempool_sequence) {
    auto event = [tx, reason, mempool_sequence, this] {
        m_internals->Iterate([&](CValidationInterface& callbacks) { callbacks.TransactionRemovedFromMempool(tx, reason, mempool_sequence); });
    };
    ENQUEUE_AND_LOG_EVENT(event, "%s: txid=%s wtxid=%s reason=%s", __func__,
                          tx->GetHash().ToString(),
                          tx->GetWitnessHash().ToString(),
                          RemovalReasonToString(reason));
}